

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O0

void __thiscall GenericModelItem::insertColumns(GenericModelItem *this,int column,int count)

{
  int iVar1;
  GenericModelItem *pGVar2;
  const_reference ppGVar3;
  reference ppGVar4;
  GenericModelItem *newChild_1;
  int j_2;
  int local_40;
  int j_1;
  int rowIndex;
  int i;
  GenericModelItem *newChild;
  int j;
  int childrenSize;
  int count_local;
  int column_local;
  GenericModelItem *this_local;
  
  if (0 < this->m_rowCount) {
    if (this->m_colCount == 0) {
      iVar1 = count * this->m_rowCount;
      QList<GenericModelItem_*>::reserve(&this->children,(long)iVar1);
      for (newChild._0_4_ = 0; (int)newChild < iVar1; newChild._0_4_ = (int)newChild + 1) {
        pGVar2 = (GenericModelItem *)operator_new(0x58);
        GenericModelItem(pGVar2,this);
        pGVar2->m_column = (int)newChild % count;
        pGVar2->m_row = (int)newChild / count;
        QList<GenericModelItem_*>::append(&this->children,pGVar2);
      }
    }
    else {
      for (j_1 = column + this->m_colCount * (this->m_rowCount + -1); -1 < j_1;
          j_1 = j_1 - this->m_colCount) {
        iVar1 = (j_1 - column) / this->m_colCount;
        if (-1 < iVar1) {
          for (local_40 = j_1; local_40 < (j_1 - column) + this->m_colCount; local_40 = local_40 + 1
              ) {
            ppGVar3 = QList<GenericModelItem_*>::at(&this->children,(long)local_40);
            (*ppGVar3)->m_column = count + (*ppGVar3)->m_column;
          }
          QList<GenericModelItem_*>::insert
                    (&this->children,(long)j_1,(long)count,(parameter_type)0x0);
          for (newChild_1._4_4_ = 0; newChild_1._4_4_ < count;
              newChild_1._4_4_ = newChild_1._4_4_ + 1) {
            pGVar2 = (GenericModelItem *)operator_new(0x58);
            GenericModelItem(pGVar2,this);
            pGVar2->m_column = column + newChild_1._4_4_;
            pGVar2->m_row = iVar1;
            ppGVar4 = QList<GenericModelItem_*>::operator[]
                                (&this->children,(long)(j_1 + newChild_1._4_4_));
            *ppGVar4 = pGVar2;
          }
        }
      }
    }
  }
  this->m_colCount = count + this->m_colCount;
  return;
}

Assistant:

void GenericModelItem::insertColumns(int column, int count)
{
    if (m_rowCount > 0) {
        if (m_colCount == 0) {
            Q_ASSERT(column == 0);
            Q_ASSERT(children.isEmpty());
            const int childrenSize = count * m_rowCount;
            children.reserve(childrenSize);
            for (int j = 0; j < childrenSize; ++j) {
                auto newChild = new GenericModelItem(this);
                newChild->m_column = j % count;
                newChild->m_row = j / count;
                children.append(newChild);
            }
        } else {
            for (int i = column + (m_colCount * (m_rowCount - 1)); i >= 0; i -= m_colCount) {
                Q_ASSERT((i - column) % m_colCount == 0);
                const int rowIndex = (i - column) / m_colCount;
                if (rowIndex < 0)
                    continue;
                for (int j = i; j < i - column + m_colCount; ++j)
                    children.at(j)->m_column += count;
                children.insert(i, count, nullptr);
                for (int j = 0; j < count; ++j) {
                    auto newChild = new GenericModelItem(this);
                    newChild->m_column = column + j;
                    newChild->m_row = rowIndex;
                    children[i + j] = newChild;
                }
            }
        }
    }
    m_colCount += count;
#ifdef QT_DEBUG
    Q_ASSERT(m_colCount * m_rowCount == children.size());
    for (int i = 0; i < children.size(); ++i) {
        Q_ASSERT(children.at(i)->row() == i / m_colCount);
        Q_ASSERT(children.at(i)->column() == i % m_colCount);
    }
#endif
}